

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::SkipByteOrderMark(Parser *this)

{
  char *pcVar1;
  string *in_RSI;
  allocator<char> local_31;
  string local_30 [32];
  
  pcVar1 = (char *)in_RSI->_M_string_length;
  if (*pcVar1 == -0x11) {
    in_RSI->_M_string_length = (size_type)(pcVar1 + 1);
    if (pcVar1[1] == -0x45) {
      in_RSI->_M_string_length = (size_type)(pcVar1 + 2);
      if (pcVar1[2] == -0x41) {
        in_RSI->_M_string_length = (size_type)(pcVar1 + 3);
        goto LAB_001140da;
      }
      std::__cxx11::string::string<std::allocator<char>>
                (local_30,"invalid utf-8 byte order mark",&local_31);
      Error(this,in_RSI);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                (local_30,"invalid utf-8 byte order mark",&local_31);
      Error(this,in_RSI);
    }
    std::__cxx11::string::~string(local_30);
  }
  else {
LAB_001140da:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::SkipByteOrderMark() {
  if (static_cast<unsigned char>(*cursor_) != 0xef) return NoError();
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbb)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  if (static_cast<unsigned char>(*cursor_) != 0xbf)
    return Error("invalid utf-8 byte order mark");
  cursor_++;
  return NoError();
}